

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contour.cpp
# Opt level: O0

void __thiscall PathBuilder::add(PathBuilder *this,Point a,Point b)

{
  int iVar1;
  mapped_type mVar2;
  value_type *pvVar3;
  bool bVar4;
  reference pvVar5;
  size_type sVar6;
  mapped_type *pmVar7;
  reference pvVar8;
  ostream *poVar9;
  iterator local_2e8;
  iterator local_2c8;
  iterator local_2a8;
  iterator local_288;
  const_iterator local_268;
  reference local_248;
  value_type *back_path_2;
  value_type *front_path_2;
  mapped_type back_path_index_2;
  mapped_type front_path_index_2;
  reverse_iterator local_210;
  reverse_iterator local_1f0;
  iterator local_1d0;
  const_iterator local_1b0;
  reference local_190;
  value_type *back_path_1;
  value_type *front_path_1;
  mapped_type back_path_index_1;
  mapped_type front_path_index_1;
  reverse_iterator local_158;
  reverse_iterator local_138;
  iterator local_118;
  const_iterator local_f8;
  reference local_d8;
  value_type *back_path;
  value_type *front_path;
  mapped_type back_path_index;
  mapped_type front_path_index;
  _Self local_b8;
  _Self local_b0;
  _Self local_a8;
  _Self local_a0;
  _Self local_98;
  _Self local_90;
  _Self local_88;
  _Self local_80;
  _Self local_78;
  bool local_69;
  iterator iStack_68;
  bool fronts_contains_b;
  _Self local_60;
  byte local_51;
  iterator iStack_50;
  bool fronts_contains_a;
  _Self local_48;
  byte local_39;
  iterator iStack_38;
  bool backs_contains_b;
  _Self local_30;
  byte local_21;
  PathBuilder *pPStack_20;
  bool backs_contains_a;
  PathBuilder *this_local;
  Point b_local;
  Point a_local;
  
  pPStack_20 = this;
  this_local = (PathBuilder *)b;
  b_local = a;
  local_30._M_node =
       (_Base_ptr)
       std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::find
                 (&this->backs,&b_local);
  iStack_38 = std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
              ::end(&this->backs);
  local_21 = std::operator!=(&local_30,&stack0xffffffffffffffc8);
  local_48._M_node =
       (_Base_ptr)
       std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::find
                 (&this->backs,(key_type *)&this_local);
  iStack_50 = std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
              ::end(&this->backs);
  local_39 = std::operator!=(&local_48,&stack0xffffffffffffffb0);
  local_60._M_node =
       (_Base_ptr)
       std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::find
                 (&this->fronts,&b_local);
  iStack_68 = std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
              ::end(&this->fronts);
  local_51 = std::operator!=(&local_60,&stack0xffffffffffffff98);
  local_78._M_node =
       (_Base_ptr)
       std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::find
                 (&this->fronts,(key_type *)&this_local);
  local_80._M_node =
       (_Base_ptr)
       std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::end
                 (&this->fronts);
  local_69 = std::operator!=(&local_78,&local_80);
  if (((local_51 & 1) != 0) || ((local_39 & 1) != 0)) {
    std::swap<Point>(&b_local,(Point *)&this_local);
    local_88._M_node =
         (_Base_ptr)
         std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::find
                   (&this->backs,&b_local);
    local_90._M_node =
         (_Base_ptr)
         std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::end
                   (&this->backs);
    local_21 = std::operator!=(&local_88,&local_90);
    local_98._M_node =
         (_Base_ptr)
         std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::find
                   (&this->backs,(key_type *)&this_local);
    local_a0._M_node =
         (_Base_ptr)
         std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::end
                   (&this->backs);
    local_39 = std::operator!=(&local_98,&local_a0);
    local_a8._M_node =
         (_Base_ptr)
         std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::find
                   (&this->fronts,&b_local);
    local_b0._M_node =
         (_Base_ptr)
         std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::end
                   (&this->fronts);
    local_51 = std::operator!=(&local_a8,&local_b0);
    local_b8._M_node =
         (_Base_ptr)
         std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::find
                   (&this->fronts,(key_type *)&this_local);
    _back_path_index =
         std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::end
                   (&this->fronts);
    local_69 = std::operator!=(&local_b8,(_Self *)&back_path_index);
  }
  bVar4 = Point::operator==(&b_local,(Point *)&this_local);
  if (!bVar4) {
    if (((((local_69 & 1U) == 0) && ((local_21 & 1) == 0)) && ((local_51 & 1) == 0)) &&
       ((local_69 & 1U) == 0)) {
      std::
      vector<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
      ::emplace_back<>(&this->paths);
      pvVar5 = std::
               vector<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
               ::back(&this->paths);
      std::deque<Point,_std::allocator<Point>_>::push_back(pvVar5,&b_local);
      pvVar5 = std::
               vector<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
               ::back(&this->paths);
      std::deque<Point,_std::allocator<Point>_>::push_back(pvVar5,(value_type *)&this_local);
      sVar6 = std::
              vector<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
              ::size(&this->paths);
      pmVar7 = std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
               ::operator[](&this->fronts,&b_local);
      *pmVar7 = (int)sVar6 + -1;
      sVar6 = std::
              vector<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
              ::size(&this->paths);
      pmVar7 = std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
               ::operator[](&this->backs,(key_type *)&this_local);
      *pmVar7 = (int)sVar6 + -1;
    }
    else {
      if (((local_69 & 1U) != 0) && ((local_21 & 1) != 0)) {
        pmVar7 = std::
                 map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                 operator[](&this->fronts,(key_type *)&this_local);
        iVar1 = *pmVar7;
        pmVar7 = std::
                 map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                 operator[](&this->backs,&b_local);
        if ((iVar1 == *pmVar7) && (((local_39 & 1) == 0 && ((local_51 & 1) == 0)))) {
          pmVar7 = std::
                   map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                   ::operator[](&this->backs,&b_local);
          pvVar5 = std::
                   vector<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
                   ::operator[](&this->paths,(long)*pmVar7);
          std::deque<Point,_std::allocator<Point>_>::push_back(pvVar5,(value_type *)&this_local);
          std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
          erase(&this->backs,&b_local);
          std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
          erase(&this->fronts,(key_type *)&this_local);
          return;
        }
      }
      if (((((local_39 & 1) == 0) || ((local_21 & 1) == 0)) || ((local_51 & 1) != 0)) ||
         ((local_69 & 1U) != 0)) {
        if ((((local_69 & 1U) == 0) || ((local_51 & 1) == 0)) ||
           (((local_21 & 1) != 0 || ((local_39 & 1) != 0)))) {
          if ((((local_69 & 1U) == 0) || ((local_21 & 1) == 0)) ||
             (((local_51 & 1) != 0 || ((local_39 & 1) != 0)))) {
            if (((((local_69 & 1U) == 0) || ((local_51 & 1) != 0)) || ((local_39 & 1) != 0)) ||
               ((local_21 & 1) != 0)) {
              if ((((local_21 & 1) == 0) || ((local_69 & 1U) != 0)) ||
                 (((local_51 & 1) != 0 || ((local_39 & 1) != 0)))) {
                if ((local_51 & 1) != 0) {
                  std::operator<<((ostream *)&std::cerr,"fronts contains a\n");
                  poVar9 = std::operator<<((ostream *)&std::cerr,"    fronts[");
                  poVar9 = operator<<(poVar9,&b_local);
                  poVar9 = std::operator<<(poVar9,"] == ");
                  pmVar7 = std::
                           map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                           ::operator[](&this->fronts,&b_local);
                  poVar9 = (ostream *)std::ostream::operator<<(poVar9,*pmVar7);
                  std::operator<<(poVar9,"\n");
                }
                if ((local_69 & 1U) != 0) {
                  std::operator<<((ostream *)&std::cerr,"fronts contains b\n");
                  poVar9 = std::operator<<((ostream *)&std::cerr,"    fronts[");
                  poVar9 = operator<<(poVar9,(Point *)&this_local);
                  poVar9 = std::operator<<(poVar9,"] == ");
                  pmVar7 = std::
                           map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                           ::operator[](&this->fronts,(key_type *)&this_local);
                  poVar9 = (ostream *)std::ostream::operator<<(poVar9,*pmVar7);
                  std::operator<<(poVar9,"\n");
                }
                if ((local_21 & 1) != 0) {
                  std::operator<<((ostream *)&std::cerr,"backs contains a\n");
                  poVar9 = std::operator<<((ostream *)&std::cerr,"    backs[");
                  poVar9 = operator<<(poVar9,&b_local);
                  poVar9 = std::operator<<(poVar9,"] == ");
                  pmVar7 = std::
                           map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                           ::operator[](&this->backs,&b_local);
                  poVar9 = (ostream *)std::ostream::operator<<(poVar9,*pmVar7);
                  std::operator<<(poVar9,"\n");
                }
                if ((local_39 & 1) != 0) {
                  std::operator<<((ostream *)&std::cerr,"backs contains b\n");
                  poVar9 = std::operator<<((ostream *)&std::cerr,"    backs[");
                  poVar9 = operator<<(poVar9,(Point *)&this_local);
                  poVar9 = std::operator<<(poVar9,"] == ");
                  pmVar7 = std::
                           map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                           ::operator[](&this->backs,(key_type *)&this_local);
                  poVar9 = (ostream *)std::ostream::operator<<(poVar9,*pmVar7);
                  std::operator<<(poVar9,"\n");
                }
                poVar9 = std::operator<<((ostream *)&std::cout,"<line x1=\"");
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,b_local.x);
                poVar9 = std::operator<<(poVar9,"\" y1=\"");
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,b_local.y);
                poVar9 = std::operator<<(poVar9,"\" x2=\"");
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,this_local._0_4_);
                poVar9 = std::operator<<(poVar9,"\" y2=\"");
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,this_local._4_4_);
                std::operator<<(poVar9,"\" style=\"stroke:rgb(0,0,255);stroke-width:1.30\" />");
                poVar9 = std::operator<<((ostream *)&std::cout,"<line x1=\"");
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,b_local.x - 10.0);
                poVar9 = std::operator<<(poVar9,"\" y1=\"");
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,b_local.y - 10.0);
                poVar9 = std::operator<<(poVar9,"\" x2=\"");
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,b_local.x - 20.0);
                poVar9 = std::operator<<(poVar9,"\" y2=\"");
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,b_local.y - 20.0);
                std::operator<<(poVar9,"\" style=\"stroke:rgb(0,0,255);stroke-width:1.00\" />");
                exit(0x20);
              }
              pmVar7 = std::
                       map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                       ::operator[](&this->backs,&b_local);
              pvVar5 = std::
                       vector<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
                       ::operator[](&this->paths,(long)*pmVar7);
              std::deque<Point,_std::allocator<Point>_>::push_back(pvVar5,(value_type *)&this_local)
              ;
              pmVar7 = std::
                       map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                       ::operator[](&this->backs,&b_local);
              mVar2 = *pmVar7;
              pmVar7 = std::
                       map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                       ::operator[](&this->backs,(key_type *)&this_local);
              *pmVar7 = mVar2;
              std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
              ::erase(&this->backs,&b_local);
            }
            else {
              pmVar7 = std::
                       map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                       ::operator[](&this->fronts,(key_type *)&this_local);
              pvVar5 = std::
                       vector<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
                       ::operator[](&this->paths,(long)*pmVar7);
              std::deque<Point,_std::allocator<Point>_>::push_front(pvVar5,&b_local);
              pmVar7 = std::
                       map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                       ::operator[](&this->fronts,(key_type *)&this_local);
              mVar2 = *pmVar7;
              pmVar7 = std::
                       map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                       ::operator[](&this->fronts,&b_local);
              *pmVar7 = mVar2;
              std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
              ::erase(&this->fronts,(key_type *)&this_local);
            }
          }
          else {
            pmVar7 = std::
                     map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                     ::operator[](&this->backs,&b_local);
            front_path_2._4_4_ = *pmVar7;
            pmVar7 = std::
                     map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                     ::operator[](&this->fronts,(key_type *)&this_local);
            front_path_2._0_4_ = *pmVar7;
            back_path_2 = std::
                          vector<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
                          ::operator[](&this->paths,(long)front_path_2._4_4_);
            local_248 = std::
                        vector<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
                        ::operator[](&this->paths,(long)(mapped_type)front_path_2);
            mVar2 = front_path_2._4_4_;
            pvVar8 = std::deque<Point,_std::allocator<Point>_>::back(local_248);
            pmVar7 = std::
                     map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                     ::operator[](&this->backs,pvVar8);
            *pmVar7 = mVar2;
            std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
            erase(&this->fronts,&b_local);
            std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
            erase(&this->fronts,(key_type *)&this_local);
            pvVar3 = back_path_2;
            std::deque<Point,_std::allocator<Point>_>::end(&local_288,back_path_2);
            std::_Deque_iterator<Point,Point_const&,Point_const*>::
            _Deque_iterator<std::_Deque_iterator<Point,Point&,Point*>,void>
                      ((_Deque_iterator<Point,Point_const&,Point_const*> *)&local_268,&local_288);
            std::deque<Point,_std::allocator<Point>_>::begin(&local_2a8,local_248);
            std::deque<Point,_std::allocator<Point>_>::end(&local_2c8,local_248);
            std::deque<Point,std::allocator<Point>>::
            insert<std::_Deque_iterator<Point,Point&,Point*>,void>
                      (&local_2e8,(deque<Point,std::allocator<Point>> *)pvVar3,&local_268,&local_2a8
                       ,&local_2c8);
            std::deque<Point,_std::allocator<Point>_>::clear(local_248);
            std::deque<Point,_std::allocator<Point>_>::shrink_to_fit(local_248);
          }
        }
        else {
          pmVar7 = std::
                   map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                   ::operator[](&this->fronts,&b_local);
          front_path_1._4_4_ = *pmVar7;
          pmVar7 = std::
                   map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                   ::operator[](&this->fronts,(key_type *)&this_local);
          front_path_1._0_4_ = *pmVar7;
          back_path_1 = std::
                        vector<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
                        ::operator[](&this->paths,(long)front_path_1._4_4_);
          local_190 = std::
                      vector<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
                      ::operator[](&this->paths,(long)(mapped_type)front_path_1);
          pvVar8 = std::deque<Point,_std::allocator<Point>_>::back(local_190);
          std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
          erase(&this->backs,pvVar8);
          mVar2 = front_path_1._4_4_;
          pvVar8 = std::deque<Point,_std::allocator<Point>_>::back(local_190);
          pmVar7 = std::
                   map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                   ::operator[](&this->fronts,pvVar8);
          *pmVar7 = mVar2;
          std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
          erase(&this->fronts,&b_local);
          std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
          erase(&this->fronts,(key_type *)&this_local);
          pvVar3 = back_path_1;
          std::deque<Point,_std::allocator<Point>_>::begin(&local_1d0,back_path_1);
          std::_Deque_iterator<Point,Point_const&,Point_const*>::
          _Deque_iterator<std::_Deque_iterator<Point,Point&,Point*>,void>
                    ((_Deque_iterator<Point,Point_const&,Point_const*> *)&local_1b0,&local_1d0);
          std::deque<Point,_std::allocator<Point>_>::rbegin(&local_1f0,local_190);
          std::deque<Point,_std::allocator<Point>_>::rend(&local_210,local_190);
          std::deque<Point,std::allocator<Point>>::
          insert<std::reverse_iterator<std::_Deque_iterator<Point,Point&,Point*>>,void>
                    ((iterator *)&back_path_index_2,(deque<Point,std::allocator<Point>> *)pvVar3,
                     &local_1b0,&local_1f0,&local_210);
          std::deque<Point,_std::allocator<Point>_>::clear(local_190);
          std::deque<Point,_std::allocator<Point>_>::shrink_to_fit(local_190);
        }
      }
      else {
        pmVar7 = std::
                 map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                 operator[](&this->backs,&b_local);
        front_path._4_4_ = *pmVar7;
        pmVar7 = std::
                 map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                 operator[](&this->backs,(key_type *)&this_local);
        front_path._0_4_ = *pmVar7;
        back_path = std::
                    vector<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
                    ::operator[](&this->paths,(long)front_path._4_4_);
        local_d8 = std::
                   vector<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
                   ::operator[](&this->paths,(long)(mapped_type)front_path);
        pvVar8 = std::deque<Point,_std::allocator<Point>_>::front(local_d8);
        std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::erase
                  (&this->fronts,pvVar8);
        mVar2 = front_path._4_4_;
        pvVar8 = std::deque<Point,_std::allocator<Point>_>::front(local_d8);
        pmVar7 = std::
                 map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                 operator[](&this->backs,pvVar8);
        *pmVar7 = mVar2;
        std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::erase
                  (&this->backs,&b_local);
        std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::erase
                  (&this->backs,(key_type *)&this_local);
        pvVar3 = back_path;
        std::deque<Point,_std::allocator<Point>_>::end(&local_118,back_path);
        std::_Deque_iterator<Point,Point_const&,Point_const*>::
        _Deque_iterator<std::_Deque_iterator<Point,Point&,Point*>,void>
                  ((_Deque_iterator<Point,Point_const&,Point_const*> *)&local_f8,&local_118);
        std::deque<Point,_std::allocator<Point>_>::rbegin(&local_138,local_d8);
        std::deque<Point,_std::allocator<Point>_>::rend(&local_158,local_d8);
        std::deque<Point,std::allocator<Point>>::
        insert<std::reverse_iterator<std::_Deque_iterator<Point,Point&,Point*>>,void>
                  ((iterator *)&back_path_index_1,(deque<Point,std::allocator<Point>> *)pvVar3,
                   &local_f8,&local_138,&local_158);
        std::deque<Point,_std::allocator<Point>_>::clear(local_d8);
        std::deque<Point,_std::allocator<Point>_>::shrink_to_fit(local_d8);
      }
    }
  }
  return;
}

Assistant:

void PathBuilder::add(Point a, Point b) {
    using namespace std;
    auto backs_contains_a = backs.find(a) != backs.end();
    auto backs_contains_b = backs.find(b) != backs.end();
    auto fronts_contains_a = fronts.find(a) != fronts.end();
    auto fronts_contains_b = fronts.find(b) != fronts.end();

    if (fronts_contains_a || backs_contains_b) {
        swap(a, b);
        backs_contains_a = backs.find(a) != backs.end();
        backs_contains_b = backs.find(b) != backs.end();
        fronts_contains_a = fronts.find(a) != fronts.end();
        fronts_contains_b = fronts.find(b) != fronts.end();
    }

    if (a == b) {
        return;
    }

    if (!fronts_contains_b && !backs_contains_a && !fronts_contains_a && !fronts_contains_b) {
        // add a new path
        paths.emplace_back();
        paths.back().push_back(a);
        paths.back().push_back(b);
        fronts[a] = paths.size()-1;
        backs[b] = paths.size()-1;
    } else if (fronts_contains_b && backs_contains_a && (fronts[b] == backs[a]) && !backs_contains_b && !fronts_contains_a) {
        // close a loop
        paths[backs[a]].push_back(b);

        backs.erase(a);
        fronts.erase(b);
    } else if (backs_contains_b && backs_contains_a && !fronts_contains_a && !fronts_contains_b) {
        // join two paths
        auto front_path_index = backs[a];
        auto back_path_index = backs[b];
        auto &front_path = paths[front_path_index];
        auto &back_path = paths[back_path_index];

        fronts.erase(back_path.front());
        backs[back_path.front()] = front_path_index;
        backs.erase(a);
        backs.erase(b);

        front_path.insert(front_path.end(), back_path.rbegin(), back_path.rend());
        back_path.clear();
        back_path.shrink_to_fit();
    } else if (fronts_contains_b && fronts_contains_a && !backs_contains_a && !backs_contains_b) {
        // join two paths
        auto front_path_index = fronts[a];
        auto back_path_index = fronts[b];
        auto &front_path = paths[front_path_index];
        auto &back_path = paths[back_path_index];

        backs.erase(back_path.back());
        fronts[back_path.back()] = front_path_index;
        fronts.erase(a);
        fronts.erase(b);

        front_path.insert(front_path.begin(), back_path.rbegin(), back_path.rend());
        back_path.clear();
        back_path.shrink_to_fit();
    } else if (fronts_contains_b && backs_contains_a && !fronts_contains_a && !backs_contains_b) {
        // join two paths
        auto front_path_index = backs[a];
        auto back_path_index = fronts[b];
        auto &front_path = paths[front_path_index];
        auto &back_path = paths[back_path_index];

        backs[back_path.back()] = front_path_index;
        fronts.erase(a);
        fronts.erase(b);

        front_path.insert(front_path.end(), back_path.begin(), back_path.end());
        back_path.clear();
        back_path.shrink_to_fit();
    } else if (fronts_contains_b && !fronts_contains_a && !backs_contains_b && !backs_contains_a) {
        // prepend to an existing path
        paths[fronts[b]].push_front(a);
        fronts[a] = fronts[b];
        fronts.erase(b);
    } else if (backs_contains_a && !fronts_contains_b && !fronts_contains_a && !backs_contains_b) {
        // append to an existing path
        paths[backs[a]].push_back(b);
        backs[b] = backs[a];
        backs.erase(a);
    } else {
        if (fronts_contains_a) {
            cerr<<"fronts contains a\n";
            cerr<<"    fronts["<<a<<"] == "<<fronts[a]<<"\n";
        }
        if (fronts_contains_b) {
            cerr<<"fronts contains b\n";
            cerr<<"    fronts["<<b<<"] == "<<fronts[b]<<"\n";
        }
        if (backs_contains_a) {
            cerr<<"backs contains a\n";
            cerr<<"    backs["<<a<<"] == "<<backs[a]<<"\n";
        }
        if (backs_contains_b) {
            cerr<<"backs contains b\n";
            cerr<<"    backs["<<b<<"] == "<<backs[b]<<"\n";
        }
        cout<<"<line x1=\""<<a.x<<"\" y1=\""<<a.y<<"\" x2=\""<<b.x<<"\" y2=\""<<b.y<<"\" style=\"stroke:rgb(0,0,255);stroke-width:1.30\" />";
        cout<<"<line x1=\""<<a.x-10<<"\" y1=\""<<a.y-10<<"\" x2=\""<<a.x-20<<"\" y2=\""<<a.y-20<<"\" style=\"stroke:rgb(0,0,255);stroke-width:1.00\" />";
        exit(32);
    }
}